

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O2

int VP8EncAnalyze(VP8Encoder *enc)

{
  uint uVar1;
  VP8MBInfo *pVVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  WebPWorkerInterface *pWVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  void *ptr;
  int iVar11;
  void *pvVar12;
  int *piVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  uint64_t nmemb;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  undefined1 local_2728 [16];
  int centers [4];
  int aiStack_26e8 [4];
  int accum [4];
  SegmentJob local_26c0;
  SegmentJob side_job;
  
  if (((enc->config_->emulate_jpeg_size == 0) && ((enc->segment_hdr_).num_segments_ < 2)) &&
     (1 < enc->method_)) {
    for (lVar8 = 0; lVar8 < (long)enc->mb_h_ * (long)enc->mb_w_; lVar8 = lVar8 + 1) {
      pVVar2 = enc->mb_info_;
      *(byte *)(pVVar2 + lVar8) = (*(byte *)(pVVar2 + lVar8) & 0x80) + 1;
      pVVar2[lVar8].alpha_ = '\0';
    }
    enc->dqm_[0].alpha_ = 0;
    enc->dqm_[0].beta_ = 0;
    enc->alpha_ = 0;
    enc->uv_alpha_ = 0;
    WebPReportProgress(enc->pic_,enc->percent_ + 0x14,&enc->percent_);
    uVar26 = 1;
  }
  else {
    iVar6 = enc->mb_h_;
    iVar15 = enc->mb_w_ * iVar6;
    iVar25 = enc->thread_level_;
    pWVar7 = WebPGetWorkerInterface();
    if ((iVar25 < 1) || (iVar25 = iVar6 * 9 + 0xf >> 4, iVar25 < 2)) {
      InitSegmentJob(enc,&local_26c0,0,iVar6);
      (*pWVar7->Execute)(&local_26c0.worker);
      uVar26 = (*pWVar7->Sync)(&local_26c0.worker);
      uVar26 = uVar26 & 1;
    }
    else {
      InitSegmentJob(enc,&local_26c0,0,iVar25);
      uVar26 = 0;
      InitSegmentJob(enc,&side_job,iVar25,iVar6);
      uVar3 = (*pWVar7->Reset)(&side_job.worker);
      if ((uVar3 & 1) != 0) {
        (*pWVar7->Launch)(&side_job.worker);
        (*pWVar7->Execute)(&local_26c0.worker);
        uVar26 = (*pWVar7->Sync)(&side_job.worker);
        uVar3 = (*pWVar7->Sync)(&local_26c0.worker);
        uVar26 = uVar3 & uVar26 & 1;
      }
      (*pWVar7->End)(&side_job.worker);
      if (uVar26 != 0) {
        for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
          local_26c0.alphas[lVar8] = local_26c0.alphas[lVar8] + side_job.alphas[lVar8];
        }
        iVar6 = local_26c0.uv_alpha;
        local_26c0.alpha = local_26c0.alpha + side_job.alpha;
        local_26c0.uv_alpha = iVar6 + side_job.uv_alpha;
      }
    }
    (*pWVar7->End)(&local_26c0.worker);
    if (uVar26 != 0) {
      enc->alpha_ = local_26c0.alpha / iVar15;
      enc->uv_alpha_ = local_26c0.uv_alpha / iVar15;
      uVar3 = (enc->segment_hdr_).num_segments_;
      uVar18 = 4;
      if ((int)uVar3 < 4) {
        uVar18 = (ulong)uVar3;
      }
      for (uVar9 = 0; uVar9 != 0x100; uVar9 = uVar9 + 1) {
        if (local_26c0.alphas[uVar9] != 0) goto LAB_00127ce1;
      }
      uVar9 = 0x100;
LAB_00127ce1:
      iVar6 = (int)uVar9;
      uVar24 = 0xff;
      if (iVar6 < 0xff) {
        uVar24 = uVar9 & 0xffffffff;
      }
      for (uVar10 = 0xff; (uVar9 & 0xffffffff) < uVar10; uVar10 = uVar10 - 1) {
        if (local_26c0.alphas[uVar10] != 0) {
          uVar24 = uVar10 & 0xffffffff;
          break;
        }
      }
      iVar25 = (int)uVar24 - iVar6;
      uVar21 = 0;
      iVar15 = (int)uVar18;
      uVar10 = 0;
      if (0 < iVar15) {
        uVar10 = uVar18;
      }
      for (; uVar10 != uVar21; uVar21 = uVar21 + 1) {
        centers[uVar21] = iVar25 / (iVar15 * 2) + iVar6;
        iVar25 = iVar25 + (int)uVar24 * 2 + iVar6 * -2;
      }
      iVar6 = 0;
      uVar18 = 0;
      do {
        iVar25 = (int)uVar18;
        if (iVar6 == 6) break;
        for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
          accum[uVar18] = 0;
          aiStack_26e8[uVar18] = 0;
        }
        iVar25 = 0;
        for (uVar18 = uVar9 & 0xffffffff; uVar18 <= uVar24; uVar18 = uVar18 + 1) {
          iVar17 = local_26c0.alphas[uVar18];
          if (iVar17 != 0) {
            lVar8 = (long)iVar25 << 0x20;
            iVar29 = iVar25;
            lVar27 = (long)iVar25;
            do {
              iVar25 = iVar29;
              lVar22 = lVar8;
              lVar19 = lVar27 + 1;
              iVar4 = (int)uVar18;
              if (iVar15 <= lVar19) break;
              uVar16 = iVar4 - centers[lVar19];
              uVar1 = -uVar16;
              if (0 < (int)uVar16) {
                uVar1 = uVar16;
              }
              uVar28 = iVar4 - centers[lVar27];
              uVar16 = -uVar28;
              if (0 < (int)uVar28) {
                uVar16 = uVar28;
              }
              lVar8 = lVar22 + 0x100000000;
              iVar29 = iVar25 + 1;
              lVar27 = lVar19;
            } while (uVar1 < uVar16);
            lVar22 = lVar22 >> 0x1e;
            piVar13 = (int *)((long)aiStack_26e8 + lVar22);
            *piVar13 = *piVar13 + iVar17 * iVar4;
            side_job.alphas[uVar18 - 0xc] = iVar25;
            piVar13 = (int *)((long)accum + lVar22);
            *piVar13 = *piVar13 + iVar17;
          }
        }
        iVar25 = 0;
        iVar17 = 0;
        iVar29 = 0;
        for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
          iVar4 = accum[uVar18];
          if (iVar4 != 0) {
            iVar5 = (iVar4 / 2 + aiStack_26e8[uVar18]) / iVar4;
            iVar11 = centers[uVar18] - iVar5;
            iVar20 = -iVar11;
            if (0 < iVar11) {
              iVar20 = iVar11;
            }
            iVar17 = iVar17 + iVar20;
            centers[uVar18] = iVar5;
            iVar29 = iVar29 + iVar5 * iVar4;
            iVar25 = iVar25 + iVar4;
          }
        }
        uVar21 = (long)(iVar25 / 2 + iVar29) / (long)iVar25;
        uVar18 = uVar21 & 0xffffffff;
        iVar25 = (int)uVar21;
        iVar6 = iVar6 + 1;
      } while (4 < iVar17);
      lVar8 = 0;
      while( true ) {
        uVar1 = enc->mb_w_;
        lVar27 = (long)(int)uVar1;
        iVar6 = enc->mb_h_;
        nmemb = iVar6 * lVar27;
        if ((long)nmemb <= lVar8) break;
        pVVar2 = enc->mb_info_;
        iVar6 = side_job.alphas[(ulong)pVVar2[lVar8].alpha_ - 0xc];
        *(byte *)(pVVar2 + lVar8) = *(byte *)(pVVar2 + lVar8) & 0x9f | ((byte)iVar6 & 3) << 5;
        pVVar2[lVar8].alpha_ = (uint8_t)centers[iVar6];
        lVar8 = lVar8 + 1;
      }
      if ((1 < (int)uVar3) && ((enc->config_->preprocessing & 1) != 0)) {
        lVar8 = 1;
        ptr = WebPSafeMalloc(nmemb,1);
        if (ptr != (void *)0x0) {
          lVar19 = (long)iVar6 + -1;
          for (; lVar22 = 1, lVar8 < lVar19; lVar8 = lVar8 + 1) {
            for (; lVar22 < lVar27 + -1; lVar22 = lVar22 + 1) {
              local_2728 = (undefined1  [16])0x0;
              lVar23 = lVar22 + lVar8 * lVar27;
              pVVar2 = enc->mb_info_ + lVar23;
              bVar14 = *(byte *)pVVar2;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + (int)~uVar1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + (int)~uVar1) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + -lVar27) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + -lVar27) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + (int)(1 - uVar1)) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + (int)(1 - uVar1)) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + -1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + -1) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + 1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + 1) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + lVar27 + -1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + lVar27 + -1) >> 3 & 0xc)) + 1;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + lVar27) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + lVar27) >> 3 & 0xc)) + 1;
              bVar14 = bVar14 >> 5 & 3;
              *(int *)(local_2728 + (*(byte *)(pVVar2 + lVar27 + 1) >> 3 & 0xc)) =
                   *(int *)(local_2728 + (*(byte *)(pVVar2 + lVar27 + 1) >> 3 & 0xc)) + 1;
              for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
                if (4 < centers[lVar30 + -4]) {
                  bVar14 = (byte)lVar30;
                  break;
                }
              }
              *(byte *)((long)ptr + lVar23) = bVar14;
            }
          }
          lVar8 = lVar27 * 4;
          pvVar12 = ptr;
          for (lVar22 = 1; pvVar12 = (void *)((long)pvVar12 + lVar27), lVar23 = 1, lVar22 < lVar19;
              lVar22 = lVar22 + 1) {
            for (; lVar23 < lVar27 + -1; lVar23 = lVar23 + 1) {
              (&enc->mb_info_[lVar23].field_0x0)[lVar8] =
                   (&enc->mb_info_[lVar23].field_0x0)[lVar8] & 0x9f |
                   (*(byte *)((long)pvVar12 + lVar23) & 3) << 5;
            }
            lVar8 = lVar8 + lVar27 * 4;
          }
          WebPSafeFree(ptr);
        }
      }
      uVar3 = (enc->segment_hdr_).num_segments_;
      iVar6 = centers[0];
      if (1 < (int)uVar3) {
        for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
          iVar15 = centers[uVar18];
          if (iVar15 <= iVar6) {
            iVar6 = iVar15;
          }
          if (centers[0] <= iVar15) {
            centers[0] = iVar15;
          }
        }
      }
      iVar15 = iVar6 + 1;
      if (centers[0] != iVar6) {
        iVar15 = centers[0];
      }
      piVar13 = &enc->dqm_[0].beta_;
      for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
        iVar17 = ((centers[uVar18] - iVar25) * 0xff) / (iVar15 - iVar6);
        iVar29 = ((centers[uVar18] - iVar6) * 0xff) / (iVar15 - iVar6);
        if (0x7e < iVar17) {
          iVar17 = 0x7f;
        }
        if (iVar17 < -0x7e) {
          iVar17 = -0x7f;
        }
        piVar13[-1] = iVar17;
        if (0xfe < iVar29) {
          iVar29 = 0xff;
        }
        if (iVar29 < 1) {
          iVar29 = 0;
        }
        *piVar13 = iVar29;
        piVar13 = piVar13 + 0xba;
      }
    }
  }
  return uVar26;
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config_->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr_.num_segments_ > 1) ||
      (enc->method_ <= 1);  // for method 0 - 1, we need preds_[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h_;
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int total_mb = last_row * enc->mb_w_;
#ifdef WEBP_USE_THREAD
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level_ > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha_ = main_job.alpha / total_mb;
      enc->uv_alpha_ = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  return ok;
}